

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

buffered_file open_buffered_file(FILE **fp)

{
  size_t in_RCX;
  int __fd;
  undefined8 *in_RSI;
  file write_end;
  file read_end;
  
  _write_end = 0xffffffffffffffff;
  fmt::v5::file::pipe(&read_end,&write_end.fd_);
  __fd = 0x142072;
  fmt::v5::file::write(&write_end,0x142072,(void *)0xc,in_RCX);
  fmt::v5::file::close(&write_end,__fd);
  fmt::v5::file::fdopen((file *)fp,(int)&read_end,"r");
  if (in_RSI != (undefined8 *)0x0) {
    *in_RSI = *fp;
  }
  fmt::v5::file::~file(&write_end);
  fmt::v5::file::~file(&read_end);
  return (buffered_file)(FILE *)fp;
}

Assistant:

fmt::buffered_file open_buffered_file(FILE **fp) {
  fmt::file read_end, write_end;
  fmt::file::pipe(read_end, write_end);
  write_end.write(FILE_CONTENT, std::strlen(FILE_CONTENT));
  write_end.close();
  fmt::buffered_file f = read_end.fdopen("r");
  if (fp)
    *fp = f.get();
  return f;
}